

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

void ApprovalTests::SystemUtils::ensureParentDirectoryExists(string *fullFilePath)

{
  ulong uVar1;
  string parentDirectory;
  string local_28 [40];
  
  FileUtils::getDirectory((string *)parentDirectory._M_string_length);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ensureDirectoryExists((string *)0x15f410);
  }
  ::std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SystemUtils::ensureParentDirectoryExists(const std::string& fullFilePath)
    {
        const std::string parentDirectory = FileUtils::getDirectory(fullFilePath);
        if (!parentDirectory.empty())
        {
            SystemUtils::ensureDirectoryExists(parentDirectory);
        }
    }